

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O2

char * string_from_atom(atom_server as,atom_t atom)

{
  char cVar1;
  int iVar2;
  Tcl_HashEntry *pTVar3;
  size_t sVar4;
  ssize_t sVar5;
  char *pcVar6;
  long lVar7;
  char buf [100];
  send_get_atom_msg tmp_rec;
  
  pTVar3 = (*(as->value_hash_table).findProc)(&as->value_hash_table,(char *)(long)atom);
  if (pTVar3 == (Tcl_HashEntry *)0x0) {
    pcVar6 = buf + 1;
    iVar2 = 0x107110;
    sprintf(pcVar6,"N%d",atom);
    iVar2 = establish_server_connection(as,iVar2);
    if (iVar2 == 0) {
      return (char *)0x0;
    }
    sVar4 = strlen(pcVar6);
    buf[0] = (char)sVar4;
    lVar7 = (long)buf[0];
    sVar4 = write(as->tcp_fd,buf,lVar7 + 1U);
    if (sVar4 == lVar7 + 1U) {
      set_blocking(as,1);
      buf[1] = '\0';
      cVar1 = '\0';
      while (cVar1 != 'S') {
        sVar5 = read(as->tcp_fd,buf,1);
        if ((int)sVar5 == -1) {
          pcVar6 = "read";
          goto LAB_00103e67;
        }
        sVar5 = read(as->tcp_fd,pcVar6,(long)buf[0]);
        if ((int)sVar5 != (int)buf[0]) {
          pcVar6 = "read2";
          goto LAB_00103e67;
        }
        buf[(int)sVar5 + 1] = '\0';
        cVar1 = 'S';
        if (buf[1] != 'S') {
          handle_unexpected_msg(as,pcVar6);
          cVar1 = buf[1];
        }
      }
      if (buf[2] != '\0') {
        pcVar6 = buf + 2;
        tmp_rec.atom_string = pcVar6;
        tmp_rec.atom = atom;
        enter_atom_into_cache(as,&tmp_rec);
        goto LAB_00103e41;
      }
    }
    else {
      pcVar6 = "write";
LAB_00103e67:
      perror(pcVar6);
    }
  }
  else {
    pcVar6 = *pTVar3->clientData;
    if (pcVar6 != (char *)0x0) {
LAB_00103e41:
      pcVar6 = strdup(pcVar6);
      return pcVar6;
    }
  }
  return (char *)0x0;
}

Assistant:

extern
char *
string_from_atom(atom_server as, atom_t atom)
{
    send_get_atom_msg tmp_rec;
    send_get_atom_msg_ptr stored;
    Tcl_HashEntry *entry = NULL;
    int numbytes;
    char buf[MAXDATASIZE];

    entry = Tcl_FindHashEntry(&as->value_hash_table, (char *) (int64_t) atom);

    if (entry == NULL) {
	sprintf(&buf[1], "N%d", atom);
	if (establish_server_connection(as, 1) == 0) return NULL;
	buf[0] = (char) strlen(&buf[1]);
	if (write(as->tcp_fd, buf, buf[0]+1) != buf[0] + 1) {
	    perror("write");
	    return NULL;
	}
	set_blocking(as, 1);	/* set server fd blocking */
	buf[1] = 0;
	while (buf[1] != 'S') {
	    if ((numbytes = read(as->tcp_fd, buf, 1)) == -1) {
		perror("read");
		return NULL;
	    }
	    if ((numbytes = read(as->tcp_fd, &buf[1], buf[0])) != buf[0]) {
		perror("read2");
		return NULL;
	    }
	    buf[numbytes+1] = 0;
	    if (buf[1] != 'S')
		handle_unexpected_msg(as, &buf[1]);
	}

	if (buf[2] == 0) {
	    return NULL;
	}
	tmp_rec.atom_string = &buf[2];
	tmp_rec.atom = atom;

	(void) enter_atom_into_cache(as, &tmp_rec);
	stored = &tmp_rec;
    } else {
	stored = (send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
    }
    if (stored->atom_string != NULL) {
	return strdup(stored->atom_string);
    } else {
	return NULL;
    }
}